

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientMonitor.cpp
# Opt level: O1

void __thiscall ClientMonitor::removeAllClients(ClientMonitor *this)

{
  Client *this_00;
  int iVar1;
  pointer ppCVar2;
  undefined8 uVar3;
  ulong uVar4;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    ppCVar2 = (this->clients).super__Vector_base<Client_*,_std::allocator<Client_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->clients).super__Vector_base<Client_*,_std::allocator<Client_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppCVar2) {
      uVar4 = 0;
      do {
        this_00 = ppCVar2[uVar4];
        if (this_00 != (Client *)0x0) {
          Client::~Client(this_00);
          operator_delete(this_00);
        }
        uVar4 = uVar4 + 1;
        ppCVar2 = (this->clients).super__Vector_base<Client_*,_std::allocator<Client_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar4 < (ulong)((long)(this->clients).
                                     super__Vector_base<Client_*,_std::allocator<Client_*>_>._M_impl
                                     .super__Vector_impl_data._M_finish - (long)ppCVar2 >> 3));
    }
    Selector::clear(this->selector);
    ppCVar2 = (this->clients).super__Vector_base<Client_*,_std::allocator<Client_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->clients).super__Vector_base<Client_*,_std::allocator<Client_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppCVar2) {
      (this->clients).super__Vector_base<Client_*,_std::allocator<Client_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppCVar2;
    }
    std::
    _Hashtable<TCPSocket,_std::pair<const_TCPSocket,_Client_*>,_std::allocator<std::pair<const_TCPSocket,_Client_*>_>,_std::__detail::_Select1st,_std::equal_to<TCPSocket>,_std::hash<TCPSocket>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&(this->socketToClientMap)._M_h);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  uVar3 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  _Unwind_Resume(uVar3);
}

Assistant:

void ClientMonitor::removeAllClients() {
    std::lock_guard<std::mutex> lock(clientListAccess);
    for(int i = 0; i < clients.size(); i++){
        if(clients[i] != nullptr){
            delete clients[i];
        }
    }

    selector.clear();
    clients.clear();
    socketToClientMap.clear();
}